

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void bilinear_filter4xh(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int h)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar18;
  short sVar19;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar37;
  undefined4 uVar47;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  short sVar48;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  short sVar66;
  undefined1 auVar67 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 uVar17;
  undefined1 auVar23 [16];
  undefined1 auVar20 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  
  if (xoffset == 0) {
    for (lVar10 = 0; (int)lVar10 <= h; lVar10 = lVar10 + 1) {
      *(undefined4 *)(dst + lVar10 * 4) = *(undefined4 *)src;
      src = src + src_stride;
    }
  }
  else if (xoffset == 4) {
    for (lVar10 = 0; (int)lVar10 <= h; lVar10 = lVar10 + 1) {
      uVar2 = *(undefined8 *)src;
      uVar14 = (undefined1)((ulong)uVar2 >> 8);
      uVar13 = pavgb(uVar14,(char)uVar2);
      uVar15 = (undefined1)((ulong)uVar2 >> 0x10);
      uVar14 = pavgb(uVar15,uVar14);
      uVar16 = (undefined1)((ulong)uVar2 >> 0x18);
      uVar15 = pavgb(uVar16,uVar15);
      uVar17 = (undefined1)((ulong)uVar2 >> 0x20);
      uVar16 = pavgb(uVar17,uVar16);
      uVar18 = (undefined1)((ulong)uVar2 >> 0x28);
      pavgb(uVar18,uVar17);
      uVar17 = (undefined1)((ulong)uVar2 >> 0x30);
      pavgb(uVar17,uVar18);
      uVar18 = (undefined1)((ulong)uVar2 >> 0x38);
      pavgb(uVar18,uVar17);
      pavgb(0,uVar18);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      pavgb(0,0);
      *(uint *)(dst + lVar10 * 4) = CONCAT13(uVar16,CONCAT12(uVar15,CONCAT11(uVar14,uVar13)));
      src = src + src_stride;
    }
  }
  else {
    auVar11 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[xoffset]),
                      ZEXT216((ushort)bilinear_filters_2t[xoffset]),0);
    auVar11._4_4_ = auVar11._0_4_;
    auVar11._8_4_ = auVar11._0_4_;
    auVar11._12_4_ = auVar11._0_4_;
    lVar10 = 0;
    while( true ) {
      uVar3 = *(ulong *)src;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar3;
      if (h <= (int)lVar10) break;
      lVar4 = *(long *)((long)src + (long)src_stride);
      uVar5 = *(ulong *)((long)src + (long)(src_stride * 2));
      lVar6 = *(long *)((long)src + (long)(src_stride * 3));
      auVar76._8_4_ = (int)(uVar3 >> 0x20);
      auVar76._0_8_ = uVar3;
      auVar76._12_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar78._0_8_ = lVar4 << 0x20;
      auVar75._4_8_ = auVar76._8_8_;
      auVar75._0_4_ = (int)lVar4;
      auVar75._12_4_ = 0;
      auVar75 = auVar75 << 0x20;
      auVar86._8_4_ = (int)(uVar5 >> 0x20);
      auVar86._0_8_ = uVar5;
      auVar86._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar88._0_8_ = lVar6 << 0x20;
      auVar85._4_8_ = auVar86._8_8_;
      auVar85._0_4_ = (int)lVar6;
      auVar85._12_4_ = 0;
      auVar85 = auVar85 << 0x20;
      auVar46._8_6_ = 0;
      auVar46._0_8_ = uVar3;
      auVar46[0xe] = (char)(uVar3 >> 0x38);
      auVar46[0xf] = (char)((ulong)lVar4 >> 0x38);
      auVar45._14_2_ = auVar46._14_2_;
      auVar45._8_5_ = 0;
      auVar45._0_8_ = uVar3;
      auVar45[0xd] = (char)((ulong)lVar4 >> 0x30);
      auVar44._13_3_ = auVar45._13_3_;
      auVar44._8_4_ = 0;
      auVar44._0_8_ = uVar3;
      auVar44[0xc] = (char)(uVar3 >> 0x30);
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._8_3_ = 0;
      auVar43._0_8_ = uVar3;
      auVar43[0xb] = (char)((ulong)lVar4 >> 0x28);
      auVar42._11_5_ = auVar43._11_5_;
      auVar42._8_2_ = 0;
      auVar42._0_8_ = uVar3;
      auVar42[10] = (char)(uVar3 >> 0x28);
      auVar41._10_6_ = auVar42._10_6_;
      auVar41[8] = 0;
      auVar41._0_8_ = uVar3;
      auVar41[9] = (char)((ulong)lVar4 >> 0x20);
      auVar40._9_7_ = auVar41._9_7_;
      auVar40[8] = (char)(uVar3 >> 0x20);
      auVar40._0_8_ = uVar3;
      auVar39._8_8_ = auVar40._8_8_;
      uVar18 = (undefined1)((ulong)lVar4 >> 0x18);
      auVar39[7] = uVar18;
      uVar15 = (undefined1)(uVar3 >> 0x18);
      auVar39[6] = uVar15;
      uVar17 = (undefined1)((ulong)lVar4 >> 0x10);
      auVar39[5] = uVar17;
      uVar14 = (undefined1)(uVar3 >> 0x10);
      auVar39[4] = uVar14;
      uVar16 = (undefined1)((ulong)lVar4 >> 8);
      auVar39[3] = uVar16;
      uVar13 = (undefined1)(uVar3 >> 8);
      auVar39[2] = uVar13;
      auVar39[0] = (undefined1)uVar3;
      auVar39[1] = (char)lVar4;
      auVar38 = pshufb(auVar39,ZEXT816(0x907050308060402));
      auVar84._0_14_ = auVar75._0_14_;
      auVar84[0xe] = uVar18;
      auVar84[0xf] = auVar38[7];
      auVar83._14_2_ = auVar84._14_2_;
      auVar83._0_13_ = auVar75._0_13_;
      auVar83[0xd] = auVar38[6];
      auVar82._13_3_ = auVar83._13_3_;
      auVar82._0_12_ = auVar75._0_12_;
      auVar82[0xc] = uVar17;
      auVar81._12_4_ = auVar82._12_4_;
      auVar81._0_11_ = auVar75._0_11_;
      auVar81[0xb] = auVar38[5];
      auVar80._11_5_ = auVar81._11_5_;
      auVar80._0_10_ = auVar75._0_10_;
      auVar80[10] = uVar16;
      auVar79._10_6_ = auVar80._10_6_;
      auVar79._0_9_ = auVar75._0_9_;
      auVar79[9] = auVar38[4];
      auVar78._9_7_ = auVar79._9_7_;
      auVar78[8] = (char)lVar4;
      auVar77._8_8_ = auVar78._8_8_;
      auVar77[7] = auVar38[3];
      auVar77[6] = uVar15;
      auVar77[5] = auVar38[2];
      auVar77[4] = uVar14;
      auVar77[3] = auVar38[1];
      auVar77[2] = uVar13;
      auVar77[1] = auVar38[0];
      auVar77[0] = auVar39[0];
      auVar38 = pmaddubsw(auVar77,auVar11);
      sVar19 = pavgw(auVar38._0_2_ >> 6,0);
      sVar31 = pavgw(auVar38._2_2_ >> 6,0);
      sVar32 = pavgw(auVar38._4_2_ >> 6,0);
      sVar33 = pavgw(auVar38._6_2_ >> 6,0);
      sVar34 = pavgw(auVar38._8_2_ >> 6,0);
      sVar35 = pavgw(auVar38._10_2_ >> 6,0);
      sVar36 = pavgw(auVar38._12_2_ >> 6,0);
      sVar37 = pavgw(auVar38._14_2_ >> 6,0);
      auVar74._8_6_ = 0;
      auVar74._0_8_ = uVar5;
      auVar74[0xe] = (char)(uVar5 >> 0x38);
      auVar74[0xf] = (char)((ulong)lVar6 >> 0x38);
      auVar73._14_2_ = auVar74._14_2_;
      auVar73._8_5_ = 0;
      auVar73._0_8_ = uVar5;
      auVar73[0xd] = (char)((ulong)lVar6 >> 0x30);
      auVar72._13_3_ = auVar73._13_3_;
      auVar72._8_4_ = 0;
      auVar72._0_8_ = uVar5;
      auVar72[0xc] = (char)(uVar5 >> 0x30);
      auVar71._12_4_ = auVar72._12_4_;
      auVar71._8_3_ = 0;
      auVar71._0_8_ = uVar5;
      auVar71[0xb] = (char)((ulong)lVar6 >> 0x28);
      auVar70._11_5_ = auVar71._11_5_;
      auVar70._8_2_ = 0;
      auVar70._0_8_ = uVar5;
      auVar70[10] = (char)(uVar5 >> 0x28);
      auVar69._10_6_ = auVar70._10_6_;
      auVar69[8] = 0;
      auVar69._0_8_ = uVar5;
      auVar69[9] = (char)((ulong)lVar6 >> 0x20);
      auVar68._9_7_ = auVar69._9_7_;
      auVar68[8] = (char)(uVar5 >> 0x20);
      auVar68._0_8_ = uVar5;
      auVar67._8_8_ = auVar68._8_8_;
      uVar18 = (undefined1)((ulong)lVar6 >> 0x18);
      auVar67[7] = uVar18;
      uVar15 = (undefined1)(uVar5 >> 0x18);
      auVar67[6] = uVar15;
      uVar17 = (undefined1)((ulong)lVar6 >> 0x10);
      auVar67[5] = uVar17;
      uVar14 = (undefined1)(uVar5 >> 0x10);
      auVar67[4] = uVar14;
      uVar16 = (undefined1)((ulong)lVar6 >> 8);
      auVar67[3] = uVar16;
      uVar13 = (undefined1)(uVar5 >> 8);
      auVar67[2] = uVar13;
      auVar67[0] = (undefined1)uVar5;
      auVar67[1] = (char)lVar6;
      auVar38 = pshufb(auVar67,ZEXT816(0x907050308060402));
      auVar94._0_14_ = auVar85._0_14_;
      auVar94[0xe] = uVar18;
      auVar94[0xf] = auVar38[7];
      auVar93._14_2_ = auVar94._14_2_;
      auVar93._0_13_ = auVar85._0_13_;
      auVar93[0xd] = auVar38[6];
      auVar92._13_3_ = auVar93._13_3_;
      auVar92._0_12_ = auVar85._0_12_;
      auVar92[0xc] = uVar17;
      auVar91._12_4_ = auVar92._12_4_;
      auVar91._0_11_ = auVar85._0_11_;
      auVar91[0xb] = auVar38[5];
      auVar90._11_5_ = auVar91._11_5_;
      auVar90._0_10_ = auVar85._0_10_;
      auVar90[10] = uVar16;
      auVar89._10_6_ = auVar90._10_6_;
      auVar89._0_9_ = auVar85._0_9_;
      auVar89[9] = auVar38[4];
      auVar88._9_7_ = auVar89._9_7_;
      auVar88[8] = (char)lVar6;
      auVar87._8_8_ = auVar88._8_8_;
      auVar87[7] = auVar38[3];
      auVar87[6] = uVar15;
      auVar87[5] = auVar38[2];
      auVar87[4] = uVar14;
      auVar87[3] = auVar38[1];
      auVar87[2] = uVar13;
      auVar87[1] = auVar38[0];
      auVar87[0] = auVar67[0];
      auVar38 = pmaddubsw(auVar87,auVar11);
      sVar48 = pavgw(auVar38._0_2_ >> 6,0);
      sVar60 = pavgw(auVar38._2_2_ >> 6,0);
      sVar61 = pavgw(auVar38._4_2_ >> 6,0);
      sVar62 = pavgw(auVar38._6_2_ >> 6,0);
      sVar63 = pavgw(auVar38._8_2_ >> 6,0);
      sVar64 = pavgw(auVar38._10_2_ >> 6,0);
      sVar65 = pavgw(auVar38._12_2_ >> 6,0);
      sVar66 = pavgw(auVar38._14_2_ >> 6,0);
      puVar1 = dst + lVar10 * 4;
      *puVar1 = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
      puVar1[1] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
      puVar1[2] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
      puVar1[3] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
      puVar1[4] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
      puVar1[5] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
      puVar1[6] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
      puVar1[7] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
      puVar1[8] = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
      puVar1[9] = (0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60);
      puVar1[10] = (0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61);
      puVar1[0xb] = (0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62);
      puVar1[0xc] = (0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63);
      puVar1[0xd] = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
      puVar1[0xe] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
      puVar1[0xf] = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
      src = (uint8_t *)((long)src + (long)(src_stride << 2));
      lVar10 = lVar10 + 4;
    }
    auVar38 = pshufb(auVar38,_DAT_0046ddf0);
    auVar11 = pmaddubsw(auVar38,auVar11);
    sVar19 = pavgw(0,auVar11._0_2_ >> 6);
    sVar31 = pavgw(0,auVar11._2_2_ >> 6);
    sVar32 = pavgw(0,auVar11._4_2_ >> 6);
    sVar33 = pavgw(0,auVar11._6_2_ >> 6);
    pavgw(0,auVar11._8_2_ >> 6);
    pavgw(0,auVar11._10_2_ >> 6);
    pavgw(0,auVar11._12_2_ >> 6);
    pavgw(0,auVar11._14_2_ >> 6);
    *(uint *)(dst + lVar10 * 4) =
         CONCAT13((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33),
                  CONCAT12((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32),
                           CONCAT11((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31)
                                    ,(0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 -
                                     (0xff < sVar19))));
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      lVar10 = 0;
      if (h < 1) {
        h = 0;
      }
      for (; h != (int)lVar10; lVar10 = lVar10 + 1) {
        uVar47 = *(undefined4 *)(dst + lVar10 * 4);
        uVar8 = *(undefined4 *)(dst + lVar10 * 4 + 4);
        uVar13 = pavgb((char)uVar8,(char)uVar47);
        uVar14 = pavgb((char)((uint)uVar8 >> 8),(char)((uint)uVar47 >> 8));
        uVar15 = pavgb((char)((uint)uVar8 >> 0x10),(char)((uint)uVar47 >> 0x10));
        uVar16 = pavgb((char)((uint)uVar8 >> 0x18),(char)((uint)uVar47 >> 0x18));
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        pavgb(0,0);
        *(uint *)(dst + lVar10 * 4) = CONCAT13(uVar16,CONCAT12(uVar15,CONCAT11(uVar14,uVar13)));
      }
    }
    else {
      auVar11 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[yoffset]),
                        ZEXT216((ushort)bilinear_filters_2t[yoffset]),0);
      auVar12._0_4_ = auVar11._0_4_;
      auVar12._4_4_ = auVar12._0_4_;
      auVar12._8_4_ = auVar12._0_4_;
      auVar12._12_4_ = auVar12._0_4_;
      for (lVar10 = 0; (int)lVar10 < h; lVar10 = lVar10 + 4) {
        uVar9 = *(uint *)(dst + lVar10 * 4);
        uVar2 = *(undefined8 *)(dst + lVar10 * 4 + 4);
        uVar47 = (undefined4)((ulong)uVar2 >> 0x20);
        auVar50._4_4_ = uVar47;
        auVar50._0_4_ = uVar47;
        uVar7 = *(undefined8 *)(dst + lVar10 * 4 + 0xc);
        auVar21._4_8_ = 0;
        auVar21._0_4_ = uVar9;
        auVar21._12_4_ = uVar47;
        auVar20._8_8_ = auVar21._8_8_;
        auVar20._0_8_ = CONCAT44((int)uVar2,uVar9);
        auVar50._8_4_ = uVar47;
        auVar50._12_4_ = (int)((ulong)uVar7 >> 0x20);
        auVar49._8_8_ = auVar50._8_8_;
        auVar49._0_8_ = CONCAT44((int)uVar7,uVar47);
        uVar18 = (undefined1)((ulong)uVar2 >> 0x38);
        auVar23[7] = (undefined1)((ulong)uVar2 >> 0x18);
        auVar30._0_14_ = auVar20._0_14_;
        auVar30[0xe] = auVar23[7];
        auVar30[0xf] = uVar18;
        auVar29._14_2_ = auVar30._14_2_;
        auVar29._0_13_ = auVar20._0_13_;
        uVar17 = (undefined1)((ulong)uVar2 >> 0x30);
        auVar29[0xd] = uVar17;
        uVar14 = (undefined1)((ulong)uVar2 >> 0x10);
        auVar28._13_3_ = auVar29._13_3_;
        auVar28._0_12_ = auVar20._0_12_;
        auVar28[0xc] = uVar14;
        auVar27._12_4_ = auVar28._12_4_;
        auVar27._0_11_ = auVar20._0_11_;
        uVar16 = (undefined1)((ulong)uVar2 >> 0x28);
        auVar27[0xb] = uVar16;
        uVar13 = (undefined1)((ulong)uVar2 >> 8);
        auVar26._11_5_ = auVar27._11_5_;
        auVar26._0_10_ = auVar20._0_10_;
        auVar26[10] = uVar13;
        auVar25._10_6_ = auVar26._10_6_;
        auVar25._0_9_ = auVar20._0_9_;
        uVar15 = (undefined1)((ulong)uVar2 >> 0x20);
        auVar25[9] = uVar15;
        auVar24._9_7_ = auVar25._9_7_;
        auVar24[8] = (char)uVar2;
        auVar24._0_8_ = auVar20._0_8_;
        auVar23._8_8_ = auVar24._8_8_;
        auVar23[6] = (char)(uVar9 >> 0x18);
        auVar23[5] = uVar14;
        auVar23[4] = (char)(uVar9 >> 0x10);
        auVar23._0_4_ = uVar9;
        auVar22._4_12_ = auVar23._4_12_;
        auVar22[3] = uVar13;
        auVar22[2] = (char)(uVar9 >> 8);
        auVar22[0] = (undefined1)uVar9;
        auVar22[1] = (char)uVar2;
        auVar11 = pmaddubsw(auVar22,auVar12);
        sVar19 = pavgw(auVar11._0_2_ >> 6,0);
        sVar31 = pavgw(auVar11._2_2_ >> 6,0);
        sVar32 = pavgw(auVar11._4_2_ >> 6,0);
        sVar33 = pavgw(auVar11._6_2_ >> 6,0);
        sVar34 = pavgw(auVar11._8_2_ >> 6,0);
        sVar35 = pavgw(auVar11._10_2_ >> 6,0);
        sVar36 = pavgw(auVar11._12_2_ >> 6,0);
        sVar37 = pavgw(auVar11._14_2_ >> 6,0);
        auVar52[7] = (undefined1)((ulong)uVar7 >> 0x18);
        auVar59._0_14_ = auVar49._0_14_;
        auVar59[0xe] = auVar52[7];
        auVar59[0xf] = (char)((ulong)uVar7 >> 0x38);
        auVar58._14_2_ = auVar59._14_2_;
        auVar58._0_13_ = auVar49._0_13_;
        auVar58[0xd] = (char)((ulong)uVar7 >> 0x30);
        uVar14 = (undefined1)((ulong)uVar7 >> 0x10);
        auVar57._13_3_ = auVar58._13_3_;
        auVar57._0_12_ = auVar49._0_12_;
        auVar57[0xc] = uVar14;
        auVar56._12_4_ = auVar57._12_4_;
        auVar56._0_11_ = auVar49._0_11_;
        auVar56[0xb] = (char)((ulong)uVar7 >> 0x28);
        uVar13 = (undefined1)((ulong)uVar7 >> 8);
        auVar55._11_5_ = auVar56._11_5_;
        auVar55._0_10_ = auVar49._0_10_;
        auVar55[10] = uVar13;
        auVar54._10_6_ = auVar55._10_6_;
        auVar54._0_9_ = auVar49._0_9_;
        auVar54[9] = (char)((ulong)uVar7 >> 0x20);
        auVar53._9_7_ = auVar54._9_7_;
        auVar53[8] = (char)uVar7;
        auVar53._0_8_ = auVar49._0_8_;
        auVar52._8_8_ = auVar53._8_8_;
        auVar52[6] = uVar18;
        auVar52[5] = uVar14;
        auVar52[4] = uVar17;
        auVar52._0_4_ = uVar47;
        auVar51._4_12_ = auVar52._4_12_;
        auVar51[3] = uVar13;
        auVar51[2] = uVar16;
        auVar51[1] = (char)uVar7;
        auVar51[0] = uVar15;
        auVar11 = pmaddubsw(auVar51,auVar12);
        sVar48 = pavgw(auVar11._0_2_ >> 6,0);
        sVar60 = pavgw(auVar11._2_2_ >> 6,0);
        sVar61 = pavgw(auVar11._4_2_ >> 6,0);
        sVar62 = pavgw(auVar11._6_2_ >> 6,0);
        sVar63 = pavgw(auVar11._8_2_ >> 6,0);
        sVar64 = pavgw(auVar11._10_2_ >> 6,0);
        sVar65 = pavgw(auVar11._12_2_ >> 6,0);
        sVar66 = pavgw(auVar11._14_2_ >> 6,0);
        puVar1 = dst + lVar10 * 4;
        *puVar1 = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
        puVar1[1] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar1[2] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar1[3] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        puVar1[4] = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        puVar1[5] = (0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35);
        puVar1[6] = (0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36);
        puVar1[7] = (0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37);
        puVar1[8] = (0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48);
        puVar1[9] = (0 < sVar60) * (sVar60 < 0x100) * (char)sVar60 - (0xff < sVar60);
        puVar1[10] = (0 < sVar61) * (sVar61 < 0x100) * (char)sVar61 - (0xff < sVar61);
        puVar1[0xb] = (0 < sVar62) * (sVar62 < 0x100) * (char)sVar62 - (0xff < sVar62);
        puVar1[0xc] = (0 < sVar63) * (sVar63 < 0x100) * (char)sVar63 - (0xff < sVar63);
        puVar1[0xd] = (0 < sVar64) * (sVar64 < 0x100) * (char)sVar64 - (0xff < sVar64);
        puVar1[0xe] = (0 < sVar65) * (sVar65 < 0x100) * (char)sVar65 - (0xff < sVar65);
        puVar1[0xf] = (0 < sVar66) * (sVar66 < 0x100) * (char)sVar66 - (0xff < sVar66);
      }
    }
  }
  return;
}

Assistant:

static void bilinear_filter4xh(const uint8_t *src, int src_stride, int xoffset,
                               int yoffset, uint8_t *dst, int h) {
  int i;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = xx_loadl_32((__m128i *)src);
      xx_storel_32(b, x);
      src += src_stride;
      b += 4;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      __m128i x = _mm_loadl_epi64((__m128i *)src);
      __m128i z = _mm_srli_si128(x, 1);
      xx_storel_32(b, _mm_avg_epu8(x, z));
      src += src_stride;
      b += 4;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h; i += 4) {
      const __m128i x0 = _mm_loadl_epi64((__m128i *)src);
      const __m128i z0 = _mm_srli_si128(x0, 1);
      const __m128i x1 = _mm_loadl_epi64((__m128i *)&src[src_stride]);
      const __m128i z1 = _mm_srli_si128(x1, 1);
      const __m128i x2 = _mm_loadl_epi64((__m128i *)&src[src_stride * 2]);
      const __m128i z2 = _mm_srli_si128(x2, 1);
      const __m128i x3 = _mm_loadl_epi64((__m128i *)&src[src_stride * 3]);
      const __m128i z3 = _mm_srli_si128(x3, 1);

      const __m128i a0 = _mm_unpacklo_epi32(x0, x1);
      const __m128i b0 = _mm_unpacklo_epi32(z0, z1);
      const __m128i a1 = _mm_unpacklo_epi32(x2, x3);
      const __m128i b1 = _mm_unpacklo_epi32(z2, z3);
      const __m128i res = filter_block_2rows(&a0, &b0, &a1, &b1, &hfilter_vec);
      _mm_storeu_si128((__m128i *)b, res);

      src += src_stride * 4;
      b += 16;
    }
    // Handle i = h separately
    const __m128i x = _mm_loadl_epi64((__m128i *)src);
    const __m128i z = _mm_srli_si128(x, 1);

    __m128i v0 = _mm_unpacklo_epi8(x, z);
    v0 = _mm_maddubs_epi16(v0, hfilter_vec);
    v0 = xx_roundn_epu16(v0, FILTER_BITS);

    xx_storel_32(b, _mm_packus_epi16(v0, v0));
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      __m128i x = xx_loadl_32((__m128i *)dst);
      __m128i y = xx_loadl_32((__m128i *)&dst[4]);
      xx_storel_32(dst, _mm_avg_epu8(x, y));
      dst += 4;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; i += 4) {
      const __m128i a = xx_loadl_32((__m128i *)dst);
      const __m128i b = xx_loadl_32((__m128i *)&dst[4]);
      const __m128i c = xx_loadl_32((__m128i *)&dst[8]);
      const __m128i d = xx_loadl_32((__m128i *)&dst[12]);
      const __m128i e = xx_loadl_32((__m128i *)&dst[16]);

      const __m128i a0 = _mm_unpacklo_epi32(a, b);
      const __m128i b0 = _mm_unpacklo_epi32(b, c);
      const __m128i a1 = _mm_unpacklo_epi32(c, d);
      const __m128i b1 = _mm_unpacklo_epi32(d, e);
      const __m128i res = filter_block_2rows(&a0, &b0, &a1, &b1, &vfilter_vec);
      _mm_storeu_si128((__m128i *)dst, res);

      dst += 16;
    }
  }
}